

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ConsumeString(Parser *this,string *output,ErrorMaker error)

{
  TokenType TVar1;
  Tokenizer *pTVar2;
  
  pTVar2 = this->input_;
  TVar1 = (pTVar2->current_).type;
  if (TVar1 == TYPE_STRING) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
    do {
      io::Tokenizer::ParseStringAppend(&(pTVar2->current_).text,output);
      io::Tokenizer::Next(this->input_);
      pTVar2 = this->input_;
    } while ((pTVar2->current_).type == TYPE_STRING);
  }
  else {
    RecordError(this,error);
  }
  return TVar1 == TYPE_STRING;
}

Assistant:

bool Parser::ConsumeString(std::string* output, ErrorMaker error) {
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    io::Tokenizer::ParseString(input_->current().text, output);
    input_->Next();
    // Allow C++ like concatenation of adjacent string tokens.
    while (LookingAtType(io::Tokenizer::TYPE_STRING)) {
      io::Tokenizer::ParseStringAppend(input_->current().text, output);
      input_->Next();
    }
    return true;
  } else {
    RecordError(error);
    return false;
  }
}